

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_19::BinaryReader::ReadImportSection(BinaryReader *this,Offset section_size)

{
  bool bVar1;
  Result RVar2;
  undefined1 *in_stack_fffffffffffffd50;
  undefined4 uVar3;
  undefined1 *in_stack_fffffffffffffd58;
  undefined4 uVar4;
  int local_220;
  undefined1 local_208 [8];
  TypeVector sig;
  bool local_19d;
  Type local_19c;
  bool mutable_;
  Type type;
  char *local_188;
  char *local_180;
  Enum local_174;
  char *local_160;
  char *local_158;
  Enum local_150;
  Enum local_14c;
  undefined1 local_148 [8];
  Limits page_limits;
  undefined1 local_e0 [8];
  Limits elem_limits;
  Type elem_type;
  uint local_70;
  Enum local_6c;
  Index sig_index;
  Enum local_64;
  undefined1 auStack_60 [3];
  uint8_t kind;
  undefined4 uStack_5c;
  string_view field_name;
  undefined1 auStack_48 [8];
  string_view module_name;
  Index i;
  Offset section_size_local;
  BinaryReader *this_local;
  
  RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xd])(this->delegate_,section_size);
  bVar1 = Succeeded(RVar2);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    RVar2 = ReadCount(this,&this->num_imports_,"import count");
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      module_name.size_._4_4_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xe])();
      bVar1 = Succeeded(module_name.size_._4_4_);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        for (module_name.size_._0_4_ = 0; (uint)module_name.size_ < this->num_imports_;
            module_name.size_._0_4_ = (uint)module_name.size_ + 1) {
          string_view::string_view((string_view *)auStack_48);
          field_name.size_._4_4_ = ReadStr(this,(string_view *)auStack_48,"import module name");
          bVar1 = Failed(field_name.size_._4_4_);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          string_view::string_view((string_view *)auStack_60);
          local_64 = (Enum)ReadStr(this,(string_view *)auStack_60,"import field name");
          bVar1 = Failed((Result)local_64);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          local_6c = (Enum)ReadU8(this,(uint8_t *)((long)&sig_index + 3),"import kind");
          bVar1 = Failed((Result)local_6c);
          uVar4 = (undefined4)((ulong)in_stack_fffffffffffffd58 >> 0x20);
          uVar3 = (undefined4)((ulong)in_stack_fffffffffffffd50 >> 0x20);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          switch(sig_index._3_1_) {
          case 0:
            RVar2 = ReadIndex(this,&local_70,"import signature index");
            bVar1 = Failed(RVar2);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            if (this->num_signatures_ <= local_70) {
              PrintError(this,"invalid import signature index");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xf])
                                    (this->delegate_,(ulong)(uint)module_name.size_,auStack_48,
                                     module_name.data_,CONCAT44(uStack_5c,_auStack_60),
                                     CONCAT44(field_name.data_._4_4_,field_name.data_._0_4_));
            bVar1 = Succeeded(RVar2);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              PrintError(this,"OnImport callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            in_stack_fffffffffffffd50 = (undefined1 *)CONCAT44(uVar3,local_70);
            RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x10])
                                    (this->delegate_,(ulong)(uint)module_name.size_,auStack_48,
                                     module_name.data_,CONCAT44(uStack_5c,_auStack_60),
                                     CONCAT44(field_name.data_._4_4_,field_name.data_._0_4_),
                                     this->num_func_imports_,in_stack_fffffffffffffd50);
            bVar1 = Succeeded(RVar2);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              PrintError(this,"OnImportFunc callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            this->num_func_imports_ = this->num_func_imports_ + 1;
            break;
          case 1:
            Limits::Limits((Limits *)local_e0);
            RVar2 = ReadTable(this,(Type *)&elem_limits.field_0x14,(Limits *)local_e0);
            bVar1 = Failed(RVar2);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xf])
                                    (this->delegate_,(ulong)(uint)module_name.size_,auStack_48,
                                     module_name.data_,CONCAT44(uStack_5c,_auStack_60),
                                     CONCAT44(field_name.data_._4_4_,field_name.data_._0_4_));
            bVar1 = Succeeded(RVar2);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              PrintError(this,"OnImport callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            in_stack_fffffffffffffd58 = local_e0;
            in_stack_fffffffffffffd50 = (undefined1 *)CONCAT44(uVar3,elem_limits._20_4_);
            RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x11])
                                    (this->delegate_,(ulong)(uint)module_name.size_,auStack_48,
                                     module_name.data_,CONCAT44(uStack_5c,_auStack_60),
                                     CONCAT44(field_name.data_._4_4_,field_name.data_._0_4_),
                                     this->num_table_imports_,in_stack_fffffffffffffd50,
                                     in_stack_fffffffffffffd58);
            bVar1 = Succeeded(RVar2);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              PrintError(this,"OnImportTable callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            this->num_table_imports_ = this->num_table_imports_ + 1;
            break;
          case 2:
            Limits::Limits((Limits *)local_148);
            local_14c = (Enum)ReadMemory(this,(Limits *)local_148);
            bVar1 = Failed((Result)local_14c);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            local_160 = (char *)auStack_48;
            local_158 = module_name.data_;
            local_150 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xf])
                                  (this->delegate_,(ulong)(uint)module_name.size_,auStack_48,
                                   module_name.data_,CONCAT44(uStack_5c,_auStack_60),
                                   CONCAT44(field_name.data_._4_4_,field_name.data_._0_4_));
            bVar1 = Succeeded((Result)local_150);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              PrintError(this,"OnImport callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            local_188 = (char *)auStack_48;
            local_180 = module_name.data_;
            in_stack_fffffffffffffd50 = local_148;
            local_174 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x12])
                                  (this->delegate_,(ulong)(uint)module_name.size_,auStack_48,
                                   module_name.data_,CONCAT44(uStack_5c,_auStack_60),
                                   CONCAT44(field_name.data_._4_4_,field_name.data_._0_4_),
                                   this->num_memory_imports_,in_stack_fffffffffffffd50);
            bVar1 = Succeeded((Result)local_174);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              PrintError(this,"OnImportMemory callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            this->num_memory_imports_ = this->num_memory_imports_ + 1;
            break;
          case 3:
            RVar2 = ReadGlobalHeader(this,&local_19c,&local_19d);
            bVar1 = Failed(RVar2);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xf])
                                    (this->delegate_,(ulong)(uint)module_name.size_,auStack_48,
                                     module_name.data_,CONCAT44(uStack_5c,_auStack_60),
                                     CONCAT44(field_name.data_._4_4_,field_name.data_._0_4_));
            bVar1 = Succeeded(RVar2);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              PrintError(this,"OnImport callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            in_stack_fffffffffffffd50 = (undefined1 *)CONCAT44(uVar3,local_19c);
            in_stack_fffffffffffffd58 = (undefined1 *)CONCAT44(uVar4,(uint)(local_19d & 1));
            RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x13])
                                    (this->delegate_,(ulong)(uint)module_name.size_,auStack_48,
                                     module_name.data_,CONCAT44(uStack_5c,_auStack_60),
                                     CONCAT44(field_name.data_._4_4_,field_name.data_._0_4_),
                                     this->num_global_imports_,in_stack_fffffffffffffd50,
                                     in_stack_fffffffffffffd58);
            bVar1 = Succeeded(RVar2);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              PrintError(this,"OnImportGlobal callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            this->num_global_imports_ = this->num_global_imports_ + 1;
            break;
          case 4:
            bVar1 = Features::exceptions_enabled(&this->options_->features);
            if (!bVar1) {
              PrintError(this,"invalid import exception kind: exceptions not allowed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                      ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_208);
            RVar2 = ReadExceptionType(this,(TypeVector *)local_208);
            bVar1 = Failed(RVar2);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              local_220 = 1;
            }
            else {
              RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xf])
                                      (this->delegate_,(ulong)(uint)module_name.size_,auStack_48,
                                       module_name.data_,CONCAT44(uStack_5c,_auStack_60),
                                       CONCAT44(field_name.data_._4_4_,field_name.data_._0_4_));
              bVar1 = Succeeded(RVar2);
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                in_stack_fffffffffffffd50 = local_208;
                RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x14])
                                        (this->delegate_,(ulong)(uint)module_name.size_,auStack_48,
                                         module_name.data_,CONCAT44(uStack_5c,_auStack_60),
                                         CONCAT44(field_name.data_._4_4_,field_name.data_._0_4_),
                                         this->num_exception_imports_,in_stack_fffffffffffffd50);
                bVar1 = Succeeded(RVar2);
                if (((bVar1 ^ 0xffU) & 1) == 0) {
                  this->num_exception_imports_ = this->num_exception_imports_ + 1;
                  local_220 = 0x11;
                }
                else {
                  PrintError(this,"OnImportException callback failed");
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  local_220 = 1;
                }
              }
              else {
                PrintError(this,"OnImport callback failed");
                Result::Result((Result *)((long)&this_local + 4),Error);
                local_220 = 1;
              }
            }
            std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector
                      ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_208);
            if (local_220 == 1) {
              return (Result)this_local._4_4_;
            }
          }
        }
        RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x15])();
        bVar1 = Succeeded(RVar2);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          Result::Result((Result *)((long)&this_local + 4),Ok);
        }
        else {
          PrintError(this,"EndImportSection callback failed");
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
      }
      else {
        PrintError(this,"OnImportCount callback failed");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
  }
  else {
    PrintError(this,"BeginImportSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadImportSection(Offset section_size) {
  CALLBACK(BeginImportSection, section_size);
  CHECK_RESULT(ReadCount(&num_imports_, "import count"));
  CALLBACK(OnImportCount, num_imports_);
  for (Index i = 0; i < num_imports_; ++i) {
    string_view module_name;
    CHECK_RESULT(ReadStr(&module_name, "import module name"));
    string_view field_name;
    CHECK_RESULT(ReadStr(&field_name, "import field name"));

    uint8_t kind;
    CHECK_RESULT(ReadU8(&kind, "import kind"));
    switch (static_cast<ExternalKind>(kind)) {
      case ExternalKind::Func: {
        Index sig_index;
        CHECK_RESULT(ReadIndex(&sig_index, "import signature index"));
        ERROR_UNLESS(sig_index < num_signatures_,
                     "invalid import signature index");
        CALLBACK(OnImport, i, module_name, field_name);
        CALLBACK(OnImportFunc, i, module_name, field_name, num_func_imports_,
                 sig_index);
        num_func_imports_++;
        break;
      }

      case ExternalKind::Table: {
        Type elem_type;
        Limits elem_limits;
        CHECK_RESULT(ReadTable(&elem_type, &elem_limits));
        CALLBACK(OnImport, i, module_name, field_name);
        CALLBACK(OnImportTable, i, module_name, field_name, num_table_imports_,
                 elem_type, &elem_limits);
        num_table_imports_++;
        break;
      }

      case ExternalKind::Memory: {
        Limits page_limits;
        CHECK_RESULT(ReadMemory(&page_limits));
        CALLBACK(OnImport, i, module_name, field_name);
        CALLBACK(OnImportMemory, i, module_name, field_name,
                 num_memory_imports_, &page_limits);
        num_memory_imports_++;
        break;
      }

      case ExternalKind::Global: {
        Type type;
        bool mutable_;
        CHECK_RESULT(ReadGlobalHeader(&type, &mutable_));
        CALLBACK(OnImport, i, module_name, field_name);
        CALLBACK(OnImportGlobal, i, module_name, field_name,
                 num_global_imports_, type, mutable_);
        num_global_imports_++;
        break;
      }

      case ExternalKind::Except: {
        ERROR_UNLESS(options_.features.exceptions_enabled(),
                     "invalid import exception kind: exceptions not allowed");
        TypeVector sig;
        CHECK_RESULT(ReadExceptionType(sig));
        CALLBACK(OnImport, i, module_name, field_name);
        CALLBACK(OnImportException, i, module_name, field_name,
                 num_exception_imports_, sig);
        num_exception_imports_++;
        break;
      }
    }
  }
  CALLBACK0(EndImportSection);
  return Result::Ok;
}